

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_type_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  Curl_easy *data;
  CURLcode CVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  ftpstate instate_00;
  char *pcVar5;
  char *pcVar6;
  char *local_30;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(conn->data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if (ftpcode != 200) {
    Curl_infof(conn->data,"Got a %03d response code instead of the assumed 200\n");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar1 = ftp_state_size(conn);
    return CVar1;
  case FTP_LIST_TYPE:
    data = conn->data;
    if (((data->set).ftp_filemethod == FTPFILE_NOCWD) &&
       (pcVar6 = *(data->req).protop, pcVar6 != (char *)0x0)) {
      local_30 = (char *)0x0;
      CVar1 = Curl_urldecode(data,pcVar6,0,&local_30,(size_t *)0x0,REJECT_CTRL);
      pcVar6 = local_30;
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar2 = strrchr(local_30,0x2f);
      if (pcVar2 == (char *)0x0) {
        (*Curl_cfree)(pcVar6);
        goto LAB_00119013;
      }
      lVar3 = 1;
      if ((long)pcVar2 - (long)pcVar6 != 0) {
        lVar3 = (long)pcVar2 - (long)pcVar6;
      }
      pcVar6[lVar3] = '\0';
    }
    else {
LAB_00119013:
      pcVar6 = (char *)0x0;
    }
    pcVar2 = (data->set).str[6];
    if ((pcVar2 == (char *)0x0) && (pcVar2 = "NLST", ((data->set).field_0x979 & 0x20) == 0)) {
      pcVar2 = "LIST";
    }
    pcVar5 = " ";
    pcVar4 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar5 = "";
      pcVar4 = "";
    }
    pcVar2 = curl_maprintf("%s%s%s",pcVar2,pcVar5,pcVar4);
    (*Curl_cfree)(pcVar6);
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",pcVar2);
    (*Curl_cfree)(pcVar2);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    (conn->proto).ftpc.state = FTP_LIST;
switchD_00118f35_default:
    return CURLE_OK;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    break;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
    break;
  default:
    goto switchD_00118f35_default;
  }
  CVar1 = ftp_state_quote(conn,true,instate_00);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_type_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200\n",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(conn);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(conn);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(conn);

  return result;
}